

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

void __thiscall
cfd::TransactionController::InsertUnlockingScript
          (TransactionController *this,Txid *txid,uint32_t vout,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *unlocking_scripts)

{
  pointer pBVar1;
  bool bVar2;
  uint32_t index;
  Transaction *this_00;
  ScriptElement *element;
  ScriptElement *element_00;
  pointer data;
  ScriptBuilder builder;
  Script script;
  ScriptBuilder local_118;
  AbstractTxInReference local_f8;
  Script local_68;
  
  this_00 = &this->transaction_;
  index = core::Transaction::GetTxInIndex(this_00,txid,vout);
  core::Transaction::GetTxIn((TxInReference *)&local_f8,this_00,index);
  core::Script::Script(&local_68,&local_f8.unlocking_script_);
  core::AbstractTxInReference::~AbstractTxInReference(&local_f8);
  bVar2 = core::Script::IsEmpty(&local_68);
  if (bVar2) {
    core::Transaction::SetUnlockingScript(this_00,index,unlocking_scripts);
  }
  else {
    local_118._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00647848;
    local_118.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    core::Script::GetElementList
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               &local_f8,&local_68);
    for (element_00 = (ScriptElement *)local_f8._vptr_AbstractTxInReference;
        element_00 != (ScriptElement *)local_f8.txid_._vptr_Txid; element_00 = element_00 + 1) {
      core::ScriptBuilder::AppendElement(&local_118,element_00);
    }
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               &local_f8);
    pBVar1 = (unlocking_scripts->
             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (data = (unlocking_scripts->
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                _M_impl.super__Vector_impl_data._M_start; data != pBVar1; data = data + 1) {
      core::ScriptBuilder::AppendData(&local_118,data);
    }
    core::ScriptBuilder::Build((Script *)&local_f8,&local_118);
    core::Transaction::SetUnlockingScript(this_00,index,(Script *)&local_f8);
    core::Script::~Script((Script *)&local_f8);
    core::ScriptBuilder::~ScriptBuilder(&local_118);
  }
  core::Script::~Script(&local_68);
  return;
}

Assistant:

void TransactionController::InsertUnlockingScript(
    const Txid& txid, uint32_t vout,
    const std::vector<ByteData>& unlocking_scripts) {
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);
  Script script = transaction_.GetTxIn(txin_index).GetUnlockingScript();
  if (script.IsEmpty()) {
    transaction_.SetUnlockingScript(txin_index, unlocking_scripts);
  } else {
    ScriptBuilder builder;
    for (const auto& element : script.GetElementList()) {
      builder.AppendElement(element);
    }
    for (const ByteData& data : unlocking_scripts) {
      builder.AppendData(data);
    }
    transaction_.SetUnlockingScript(txin_index, builder.Build());
  }
}